

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O3

uint8_t * __thiscall
google::protobuf::io::EpsCopyOutputStream::WriteCord
          (EpsCopyOutputStream *this,Cord *cord,uint8_t *ptr)

{
  int iVar1;
  ptrdiff_t pVar2;
  uint8_t *puVar3;
  ulong uVar4;
  
  pVar2 = GetSize(this,ptr);
  uVar4 = (ulong)(cord->contents_).data_.rep_.field_0.data[0];
  if (this->stream_ == (ZeroCopyOutputStream *)0x0) {
    if ((uVar4 & 1) == 0) {
      uVar4 = uVar4 >> 1;
    }
    else {
      uVar4 = ((cord->contents_).data_.rep_.field_0.as_tree.rep)->length;
    }
    if ((long)uVar4 <= (long)(int)pVar2) goto LAB_00f90227;
  }
  else {
    if ((uVar4 & 1) == 0) {
      uVar4 = uVar4 >> 1;
    }
    else {
      uVar4 = ((cord->contents_).data_.rep_.field_0.as_tree.rep)->length;
    }
    if (((long)uVar4 <= (long)(int)pVar2) && ((long)uVar4 < 0x200)) {
LAB_00f90227:
      puVar3 = anon_unknown_1::CopyCordToArray(cord,ptr);
      return puVar3;
    }
    puVar3 = Trim(this,ptr);
    iVar1 = (*this->stream_->_vptr_ZeroCopyOutputStream[7])(this->stream_,cord);
    if ((char)iVar1 != '\0') {
      return puVar3;
    }
  }
  this->had_error_ = true;
  this->end_ = this->buffer_ + 0x10;
  return this->buffer_;
}

Assistant:

uint8_t* EpsCopyOutputStream::WriteCord(const absl::Cord& cord, uint8_t* ptr) {
  int s = GetSize(ptr);
  if (stream_ == nullptr) {
    if (static_cast<int64_t>(cord.size()) <= s) {
      // Just copy it to the current buffer.
      return CopyCordToArray(cord, ptr);
    } else {
      return Error();
    }
  } else if (static_cast<int64_t>(cord.size()) <= s &&
             static_cast<int64_t>(cord.size()) < kMaxCordBytesToCopy) {
    // Just copy it to the current buffer.
    return CopyCordToArray(cord, ptr);
  } else {
    // Back up to the position where the Cord should start.
    ptr = Trim(ptr);
    if (!stream_->WriteCord(cord)) return Error();
    return ptr;
  }
}